

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map_checked.hh
# Opt level: O0

uint64_t __thiscall doublechecked::Roaring64Map::minimum(Roaring64Map *this)

{
  bool bVar1;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *this_00;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *psVar2;
  reference puVar3;
  unsigned_long in_RDI;
  uint64_t ans;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_ffffffffffffffc8;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd8;
  Roaring64Map *in_stack_ffffffffffffffe8;
  
  this_00 = (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
            roaring::Roaring64Map::minimum(in_stack_ffffffffffffffe8);
  bVar1 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::empty
                    ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *
                     )0x1137ab);
  if (bVar1) {
    in_stack_ffffffffffffffd0 = this_00;
    psVar2 = (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             std::numeric_limits<unsigned_long>::max();
    bVar1 = in_stack_ffffffffffffffd0 == psVar2;
  }
  else {
    in_stack_ffffffffffffffc8 = this_00;
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::begin
              (this_00);
    puVar3 = std::_Rb_tree_const_iterator<unsigned_long>::operator*
                       ((_Rb_tree_const_iterator<unsigned_long> *)0x1137fa);
    bVar1 = in_stack_ffffffffffffffc8 ==
            (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)*puVar3;
  }
  _assert_true(in_RDI,(char *)CONCAT17(bVar1,in_stack_ffffffffffffffd8),
               (char *)in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  return (uint64_t)this_00;
}

Assistant:

uint64_t minimum() const {
        uint64_t ans = plain.minimum();
        assert_true(check.empty()
                        ? ans == (std::numeric_limits<uint64_t>::max)()
                        : ans == *check.begin());
        return ans;
    }